

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

fio_protocol_s *
fio_cluster_protocol_alloc
          (intptr_t uuid,_func_void_cluster_pr_s_ptr *handler,_func_void_void_ptr_intptr_t *sender)

{
  fio_protocol_s *pfVar1;
  int *piVar2;
  undefined1 local_b8 [48];
  undefined1 local_88 [48];
  code *local_58;
  undefined8 local_50;
  code *local_48;
  code *local_40;
  code *local_38;
  undefined8 local_30;
  fio_protocol_s *local_28;
  cluster_pr_s *p;
  _func_void_void_ptr_intptr_t *sender_local;
  _func_void_cluster_pr_s_ptr *handler_local;
  intptr_t uuid_local;
  
  p = (cluster_pr_s *)sender;
  sender_local = (_func_void_void_ptr_intptr_t *)handler;
  handler_local = (_func_void_cluster_pr_s_ptr *)uuid;
  local_28 = (fio_protocol_s *)fio_mmap(0x40c8);
  if (local_28 == (fio_protocol_s *)0x0) {
    if (0 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR("FATAL: Cluster protocol allocation failed.");
    }
    piVar2 = __errno_location();
    exit(*piVar2);
  }
  local_58 = fio_cluster_on_data;
  local_50 = 0;
  local_48 = fio_cluster_on_shutdown;
  local_40 = fio_cluster_on_close;
  local_38 = fio_cluster_ping;
  local_30 = 0;
  memcpy(local_28,&local_58,0x30);
  local_28[3].on_close = (_func_void_intptr_t_fio_protocol_s_ptr *)handler_local;
  local_28[1].on_ready = (_func_void_intptr_t_fio_protocol_s_ptr *)sender_local;
  local_28[1].on_shutdown = (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)p;
  pfVar1 = local_28 + 1;
  memset(local_88,0,0x30);
  memcpy(&pfVar1->on_close,local_88,0x30);
  pfVar1 = local_28 + 2;
  memset(local_b8,0,0x30);
  memcpy(&pfVar1->on_close,local_b8,0x30);
  *(undefined1 *)((long)&local_28[4].on_data + 4) = 0;
  return local_28;
}

Assistant:

static inline fio_protocol_s *
fio_cluster_protocol_alloc(intptr_t uuid,
                           void (*handler)(struct cluster_pr_s *pr),
                           void (*sender)(void *data, intptr_t auuid)) {
  cluster_pr_s *p = fio_mmap(sizeof(*p));
  if (!p) {
    FIO_LOG_FATAL("Cluster protocol allocation failed.");
    exit(errno);
  }
  p->protocol = (fio_protocol_s){
      .ping = fio_cluster_ping,
      .on_close = fio_cluster_on_close,
      .on_shutdown = fio_cluster_on_shutdown,
      .on_data = fio_cluster_on_data,
  };
  p->uuid = uuid;
  p->handler = handler;
  p->sender = sender;
  p->pubsub = (fio_sub_hash_s)FIO_SET_INIT;
  p->patterns = (fio_sub_hash_s)FIO_SET_INIT;
  p->lock = FIO_LOCK_INIT;
  return &p->protocol;
}